

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall pbrt::StatsAccumulator::StatsAccumulator(StatsAccumulator *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  Stats *in_stack_00000030;
  
  *in_RDI = 0;
  pvVar1 = operator_new(0x2c8);
  Stats::Stats(in_stack_00000030);
  *in_RDI = pvVar1;
  return;
}

Assistant:

StatsAccumulator::StatsAccumulator() {
    stats = new Stats;
}